

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplace_back<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,DistItem *args)

{
  iterator pDVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::DistExpression::DistItem> *in_RDI;
  DistItem *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::DistExpression::DistItem> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::DistExpression::DistItem&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pDVar1 = end(in_RDI);
    pDVar1->value = (Expression *)*in_RSI;
    *(undefined8 *)
     &(pDVar1->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
         in_RSI[1];
    (pDVar1->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
    _M_value.expr = (Expression *)in_RSI[2];
    *(undefined8 *)
     &(pDVar1->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
         in_RSI[3];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }